

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void SimpleLoggerMgr::compressWorker(void)

{
  mutex *__mutex;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  EVP_PKEY_CTX *ctx;
  undefined4 extraout_var;
  atomic<SimpleLoggerMgr_*> this;
  
  ctx = (EVP_PKEY_CTX *)pthread_self();
  pthread_setname_np((pthread_t)ctx,"sl_compressor");
  this = instance;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar5 = init(ctx);
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar5);
  }
  if (((((__pointer_type)this._M_b._M_p)->termination)._M_base._M_i & 1U) != 0) {
    return;
  }
  __mutex = &((__pointer_type)this._M_b._M_p)->pendingCompElemsLock;
  do {
    sleepCompressor((SimpleLoggerMgr *)this._M_b._M_p,500);
    do {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      p_Var2 = (((__pointer_type)this._M_b._M_p)->pendingCompElems).
               super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)&((__pointer_type)this._M_b._M_p)->pendingCompElems) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_00107374:
        bVar4 = true;
      }
      else {
        p_Var3 = p_Var2[1]._M_next;
        psVar1 = &(((__pointer_type)this._M_b._M_p)->pendingCompElems).
                  super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var2);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (p_Var3 == (_List_node_base *)0x0) goto LAB_00107374;
        SimpleLogger::doCompression((SimpleLogger *)p_Var3->_M_prev,(size_t)p_Var3->_M_next);
        operator_delete(p_Var3);
        bVar4 = false;
      }
      if (((((__pointer_type)this._M_b._M_p)->termination)._M_base._M_i & 1U) != 0) {
        return;
      }
    } while (!bVar4);
  } while( true );
}

Assistant:

void SimpleLoggerMgr::compressWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_compressor");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    bool sleep_next_time = true;
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        if (sleep_next_time) {
            mgr->sleepCompressor(sub_ms);
        }
        sleep_next_time = true;

        CompElem* elem = nullptr;
        {   std::lock_guard<std::mutex> l(mgr->pendingCompElemsLock);
            auto entry = mgr->pendingCompElems.begin();
            if (entry != mgr->pendingCompElems.end()) {
                elem = *entry;
                mgr->pendingCompElems.erase(entry);
            }
        }

        if (elem) {
            elem->targetLogger->doCompression(elem->fileNum);
            delete elem;
            // Continuous compression if pending item exists.
            sleep_next_time = false;
        }
    }
}